

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseDiscriminator(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  ParseState *pPVar6;
  ParseState copy;
  
  iVar1 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar1 + 1;
  state->steps = iVar2 + 1;
  pPVar6 = (ParseState *)(ulong)(0xff < iVar1);
  if (iVar2 < 0x20000 && 0xff >= iVar1) {
    iVar1 = (state->parse_state).mangled_idx;
    iVar2 = (state->parse_state).out_cur_idx;
    iVar3 = (state->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&(state->parse_state).field_0xc;
    bVar5 = ParseOneCharToken(state,'_');
    pPVar6 = (ParseState *)(ulong)bVar5;
    if (bVar5) {
      bVar5 = ParseCharClass(state,"0123456789");
      pPVar6 = (ParseState *)(ulong)bVar5;
      if (!bVar5) {
        bVar5 = ParseOneCharToken(state,'_');
        if (bVar5) {
          bVar5 = ParseNumber(state,(int *)0x0);
          if (bVar5) {
            bVar5 = ParseOneCharToken(state,'_');
            pPVar6 = (ParseState *)(ulong)bVar5;
            if (bVar5) goto LAB_0026c6d0;
          }
        }
        pPVar6 = &state->parse_state;
        pPVar6->mangled_idx = iVar1;
        pPVar6->out_cur_idx = iVar2;
        (state->parse_state).prev_name_idx = iVar3;
        *(undefined4 *)&(state->parse_state).field_0xc = uVar4;
      }
    }
  }
LAB_0026c6d0:
  state->recursion_depth = state->recursion_depth + -1;
  return SUB81(pPVar6,0);
}

Assistant:

static bool ParseDiscriminator(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // Both forms start with _ so parse that first.
  if (!ParseOneCharToken(state, '_')) return false;

  // <digit>
  if (ParseDigit(state, nullptr)) return true;

  // _ <number> _
  if (ParseOneCharToken(state, '_') && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;
  return false;
}